

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O3

int32_t icu_63::RegexCImpl::appendTail
                  (RegularExpression *regexp,UChar **destBuf,int32_t *destCapacity,
                  UErrorCode *status)

{
  UErrorCode UVar1;
  uint destCapacity_00;
  int iVar2;
  UChar *dest;
  RegexMatcher *pRVar3;
  long limit;
  UChar *pUVar4;
  int iVar5;
  UErrorCode UVar6;
  uint uVar7;
  int64_t start;
  ulong uVar8;
  UErrorCode newStatus;
  UErrorCode local_34;
  
  UVar1 = *status;
  if (destCapacity == (int32_t *)0x0 || UVar1 != U_BUFFER_OVERFLOW_ERROR) {
    if (U_ZERO_ERROR < UVar1) {
      return 0;
    }
  }
  else {
    if (*destCapacity != 0) {
      return 0;
    }
    *status = U_ZERO_ERROR;
  }
  uVar7 = 0;
  UVar6 = U_ILLEGAL_ARGUMENT_ERROR;
  if ((regexp == (RegularExpression *)0x0) || (regexp->fMagic != 0x72657870)) goto LAB_0015d0b7;
  if ((regexp->fText == (UChar *)0x0) && (regexp->fOwnsText == '\0')) {
    UVar6 = U_REGEX_INVALID_STATE;
    uVar7 = 0;
    goto LAB_0015d0b7;
  }
  if (destBuf == (UChar **)0x0 || destCapacity == (int32_t *)0x0) goto LAB_0015d0b7;
  dest = *destBuf;
  destCapacity_00 = *destCapacity;
  uVar7 = 0;
  if (0 < (int)destCapacity_00 && dest == (UChar *)0x0 || (int)destCapacity_00 < 0)
  goto LAB_0015d0b7;
  pRVar3 = regexp->fMatcher;
  if (regexp->fText == (UChar *)0x0) {
    if (pRVar3->fMatch == '\0') {
      start = 0;
      if (pRVar3->fLastMatchEnd != -1) {
        start = pRVar3->fLastMatchEnd;
      }
    }
    else {
      start = pRVar3->fMatchEnd;
    }
    uVar7 = utext_extract_63(pRVar3->fInputText,start,pRVar3->fInputLength,dest,destCapacity_00,
                             status);
    uVar8 = (ulong)uVar7;
  }
  else {
    limit = pRVar3->fSmallData[(ulong)(pRVar3->fMatch == '\0') - 7];
    uVar8 = 0;
    iVar5 = 0;
    if (limit != -1) {
      if (pRVar3->fInputText->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0) {
        iVar5 = (int)limit;
      }
      else {
        local_34 = U_ZERO_ERROR;
        iVar5 = utext_extract_63(pRVar3->fInputText,0,limit,(UChar *)0x0,0,&local_34);
      }
    }
    iVar2 = regexp->fTextLength;
    uVar7 = iVar2 - iVar5;
    if (uVar7 != 0) {
      pUVar4 = regexp->fText;
      uVar8 = 0;
      do {
        if ((iVar2 == -1) && (pUVar4[(long)iVar5 + uVar8] == L'\0')) {
          regexp->fTextLength = iVar5 + (int)uVar8;
          goto LAB_0015d062;
        }
        if (uVar8 < destCapacity_00) {
          dest[uVar8] = pUVar4[(long)iVar5 + uVar8];
        }
        else if (0 < iVar2) {
          uVar8 = (ulong)(uint)(iVar2 - iVar5);
          goto LAB_0015d062;
        }
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      uVar8 = (ulong)uVar7;
    }
  }
LAB_0015d062:
  uVar7 = (uint)uVar8;
  if ((int)uVar7 < (int)destCapacity_00) {
    dest[(int)uVar7] = L'\0';
    *destBuf = *destBuf + (int)uVar7;
    iVar5 = *destCapacity - uVar7;
LAB_0015d0a5:
    *destCapacity = iVar5;
  }
  else {
    UVar6 = U_BUFFER_OVERFLOW_ERROR;
    if (uVar7 == destCapacity_00) {
      UVar6 = U_STRING_NOT_TERMINATED_WARNING;
    }
    *status = UVar6;
    if (*destBuf != (UChar *)0x0) {
      *destBuf = *destBuf + destCapacity_00;
      iVar5 = 0;
      goto LAB_0015d0a5;
    }
  }
  if (destCapacity == (int32_t *)0x0 || UVar1 != U_BUFFER_OVERFLOW_ERROR) {
    return uVar7;
  }
  if (U_ZERO_ERROR < *status) {
    return uVar7;
  }
  UVar6 = U_BUFFER_OVERFLOW_ERROR;
LAB_0015d0b7:
  *status = UVar6;
  return uVar7;
}

Assistant:

int32_t RegexCImpl::appendTail(RegularExpression    *regexp,
                               UChar                **destBuf,
                               int32_t               *destCapacity,
                               UErrorCode            *status)
{

    // If we come in with a buffer overflow error, don't suppress the operation.
    //  A series of appendReplacements, appendTail need to correctly preflight
    //  the buffer size when an overflow happens somewhere in the middle.
    UBool pendingBufferOverflow = FALSE;
    if (*status == U_BUFFER_OVERFLOW_ERROR && destCapacity != NULL && *destCapacity == 0) {
        pendingBufferOverflow = TRUE;
        *status = U_ZERO_ERROR;
    }

    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }

    if (destCapacity == NULL || destBuf == NULL ||
        (*destBuf == NULL && *destCapacity > 0) ||
        *destCapacity < 0)
    {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    RegexMatcher *m = regexp->fMatcher;

    int32_t  destIdx     = 0;
    int32_t  destCap     = *destCapacity;
    UChar    *dest       = *destBuf;

    if (regexp->fText != NULL) {
        int32_t srcIdx;
        int64_t nativeIdx = (m->fMatch ? m->fMatchEnd : m->fLastMatchEnd);
        if (nativeIdx == -1) {
            srcIdx = 0;
        } else if (UTEXT_USES_U16(m->fInputText)) {
            srcIdx = (int32_t)nativeIdx;
        } else {
            UErrorCode newStatus = U_ZERO_ERROR;
            srcIdx = utext_extract(m->fInputText, 0, nativeIdx, NULL, 0, &newStatus);
        }

        for (;;) {
            U_ASSERT(destIdx >= 0);

            if (srcIdx == regexp->fTextLength) {
                break;
            }
            UChar c = regexp->fText[srcIdx];
            if (c == 0 && regexp->fTextLength == -1) {
                regexp->fTextLength = srcIdx;
                break;
            }

            if (destIdx < destCap) {
                dest[destIdx] = c;
            } else {
                // We've overflowed the dest buffer.
                //  If the total input string length is known, we can
                //    compute the total buffer size needed without scanning through the string.
                if (regexp->fTextLength > 0) {
                    destIdx += (regexp->fTextLength - srcIdx);
                    break;
                }
            }
            srcIdx++;
            destIdx++;
        }
    } else {
        int64_t  srcIdx;
        if (m->fMatch) {
            // The most recent call to find() succeeded.
            srcIdx = m->fMatchEnd;
        } else {
            // The last call to find() on this matcher failed().
            //   Look back to the end of the last find() that succeeded for src index.
            srcIdx = m->fLastMatchEnd;
            if (srcIdx == -1)  {
                // There has been no successful match with this matcher.
                //   We want to copy the whole string.
                srcIdx = 0;
            }
        }

        destIdx = utext_extract(m->fInputText, srcIdx, m->fInputLength, dest, destCap, status);
    }

    //
    //  NUL terminate the output string, if possible, otherwise issue the
    //   appropriate error or warning.
    //
    if (destIdx < destCap) {
        dest[destIdx] = 0;
    } else  if (destIdx == destCap) {
        *status = U_STRING_NOT_TERMINATED_WARNING;
    } else {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    //
    // Update the user's buffer ptr and capacity vars to reflect the
    //   amount used.
    //
    if (destIdx < destCap) {
        *destBuf      += destIdx;
        *destCapacity -= destIdx;
    } else if (*destBuf != NULL) {
        *destBuf      += destCap;
        *destCapacity  = 0;
    }

    if (pendingBufferOverflow && U_SUCCESS(*status)) {
        *status = U_BUFFER_OVERFLOW_ERROR;
    }

    return destIdx;
}